

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O0

void __thiscall
Address_ElementsSourceDataConstructorTest_Test::TestBody
          (Address_ElementsSourceDataConstructorTest_Test *this)

{
  undefined4 uVar1;
  bool bVar2;
  byte bVar3;
  reference paVar4;
  char *pcVar5;
  char *pcVar6;
  char *in_R9;
  AssertHelper local_c88;
  Message local_c80;
  ByteData local_c78;
  string local_c60;
  string local_c40;
  undefined1 local_c20 [8];
  AssertionResult gtest_ar_4;
  Message local_c08;
  NetType local_bfc;
  undefined1 local_bf8 [8];
  AssertionResult gtest_ar_3;
  Message local_be0;
  AddressType local_bd4;
  undefined1 local_bd0 [8];
  AssertionResult gtest_ar_2;
  Message local_bb8;
  AddressType local_bb0 [2];
  undefined1 local_ba8 [8];
  AssertionResult gtest_ar_1;
  Message local_b90;
  string local_b88;
  undefined1 local_b68 [8];
  AssertionResult gtest_ar;
  AssertHelper local_b38;
  Message local_b30;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_b28;
  bool local_b09;
  undefined1 local_b08 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_ad8;
  Message local_ad0;
  bool local_ac1;
  undefined1 local_ac0 [8];
  AssertionResult gtest_ar__1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a98;
  ByteData local_a80;
  AssertHelper local_a68;
  Message local_a60;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_a58;
  Address local_a40;
  string local_8c8;
  ByteData160 local_8a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_890;
  ByteData local_878;
  AssertHelper local_860;
  Message local_858;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_850;
  Address local_838;
  string local_6c0;
  string local_6a0;
  AssertHelper local_680;
  Message local_678;
  bool local_669;
  undefined1 local_668 [8];
  AssertionResult gtest_ar_;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_640;
  ByteData local_628;
  AssertHelper local_610;
  Message local_608;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_600;
  Address local_5e8;
  string local_470;
  ByteData160 local_450;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_438;
  ByteData local_420;
  AssertHelper local_408;
  Message local_400 [2];
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_3f0;
  Address local_3d8;
  string local_260;
  undefined1 local_240 [8];
  ByteData hash;
  undefined1 local_218 [8];
  ElementsUnblindedAddressTestVector test;
  const_iterator __end1;
  const_iterator __begin1;
  vector<ElementsUnblindedAddressTestVector,_std::allocator<ElementsUnblindedAddressTestVector>_>
  *__range1;
  Address addr;
  Address_ElementsSourceDataConstructorTest_Test *this_local;
  
  addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  cfd::core::Address::Address((Address *)&__range1);
  __end1 = std::
           vector<ElementsUnblindedAddressTestVector,_std::allocator<ElementsUnblindedAddressTestVector>_>
           ::begin(&test_vectors);
  test.script.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                vector<ElementsUnblindedAddressTestVector,_std::allocator<ElementsUnblindedAddressTestVector>_>
                ::end(&test_vectors);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_ElementsUnblindedAddressTestVector_*,_std::vector<ElementsUnblindedAddressTestVector,_std::allocator<ElementsUnblindedAddressTestVector>_>_>
                                     *)&test.script.script_stack_.
                                        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar2)
  {
    paVar4 = __gnu_cxx::
             __normal_iterator<const_ElementsUnblindedAddressTestVector_*,_std::vector<ElementsUnblindedAddressTestVector,_std::allocator<ElementsUnblindedAddressTestVector>_>_>
             ::operator*(&__end1);
    anon_struct_120_5_385e3975::ElementsUnblindedAddressTestVector
              ((anon_struct_120_5_385e3975 *)local_218,paVar4);
    cfd::core::ByteData::ByteData((ByteData *)local_240);
    if ((test.address.field_2._12_4_ == 4) || (test.address.field_2._12_4_ == 3)) {
      cfd::core::Pubkey::GetHex_abi_cxx11_(&local_260,(Pubkey *)&test.net_type);
      bVar3 = std::__cxx11::string::empty();
      std::__cxx11::string::~string((string *)&local_260);
      if (((bVar3 ^ 0xff) & 1) == 0) {
        cfd::core::Script::GetHex_abi_cxx11_
                  (&local_470,
                   (Script *)
                   ((long)&test.pubkey.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data + 0x10));
        bVar3 = std::__cxx11::string::empty();
        std::__cxx11::string::~string((string *)&local_470);
        if (((bVar3 ^ 0xff) & 1) == 0) {
          local_669 = false;
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_668,&local_669,(type *)0x0);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_668);
          if (!bVar2) {
            testing::Message::Message(&local_678);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_6a0,(internal *)local_668,(AssertionResult *)0x73e56f,"true","false",
                       in_R9);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_680,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                       ,0x3a0,pcVar5);
            testing::internal::AssertHelper::operator=(&local_680,&local_678);
            testing::internal::AssertHelper::~AssertHelper(&local_680);
            std::__cxx11::string::~string((string *)&local_6a0);
            testing::Message::~Message(&local_678);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_668);
        }
        else {
          bVar2 = testing::internal::AlwaysTrue();
          if (bVar2) {
            bVar2 = testing::internal::AlwaysTrue();
            uVar1 = test.address.field_2._8_4_;
            if (bVar2) {
              cfd::core::GetElementsAddressFormatList();
              cfd::core::Address::Address
                        (&local_5e8,uVar1,kVersion0,
                         (Script *)
                         ((long)&test.pubkey.data_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data + 0x10),&local_600);
              cfd::core::Address::operator=((Address *)&__range1,&local_5e8);
              cfd::core::Address::~Address(&local_5e8);
              std::
              vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
              ~vector(&local_600);
            }
          }
          else {
            testing::Message::Message(&local_608);
            testing::internal::AssertHelper::AssertHelper
                      (&local_610,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                       ,0x39c,
                       "Expected: (addr = Address(test.net_type, WitnessVersion::kVersion0, test.script, GetElementsAddressFormatList())) doesn\'t throw an exception.\n  Actual: it throws."
                      );
            testing::internal::AssertHelper::operator=(&local_610,&local_608);
            testing::internal::AssertHelper::~AssertHelper(&local_610);
            testing::Message::~Message(&local_608);
          }
          cfd::core::HashUtil::Sha256
                    ((ByteData256 *)&gtest_ar_.message_,
                     (Script *)
                     ((long)&test.pubkey.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data + 0x10));
          cfd::core::ByteData256::GetBytes(&local_640,(ByteData256 *)&gtest_ar_.message_);
          cfd::core::ByteData::ByteData(&local_628,&local_640);
          cfd::core::ByteData::operator=((ByteData *)local_240,&local_628);
          cfd::core::ByteData::~ByteData(&local_628);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_640);
          cfd::core::ByteData256::~ByteData256((ByteData256 *)&gtest_ar_.message_);
        }
      }
      else {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          bVar2 = testing::internal::AlwaysTrue();
          uVar1 = test.address.field_2._8_4_;
          if (bVar2) {
            cfd::core::GetElementsAddressFormatList();
            cfd::core::Address::Address
                      (&local_3d8,uVar1,kVersion0,(Pubkey *)&test.net_type,&local_3f0);
            cfd::core::Address::operator=((Address *)&__range1,&local_3d8);
            cfd::core::Address::~Address(&local_3d8);
            std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ::~vector(&local_3f0);
          }
        }
        else {
          testing::Message::Message(local_400);
          testing::internal::AssertHelper::AssertHelper
                    (&local_408,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                     ,0x395,
                     "Expected: (addr = Address(test.net_type, WitnessVersion::kVersion0, test.pubkey, GetElementsAddressFormatList())) doesn\'t throw an exception.\n  Actual: it throws."
                    );
          testing::internal::AssertHelper::operator=(&local_408,local_400);
          testing::internal::AssertHelper::~AssertHelper(&local_408);
          testing::Message::~Message(local_400);
        }
        cfd::core::HashUtil::Hash160(&local_450,(Pubkey *)&test.net_type);
        cfd::core::ByteData160::GetBytes(&local_438,&local_450);
        cfd::core::ByteData::ByteData(&local_420,&local_438);
        cfd::core::ByteData::operator=((ByteData *)local_240,&local_420);
        cfd::core::ByteData::~ByteData(&local_420);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_438);
        cfd::core::ByteData160::~ByteData160(&local_450);
      }
    }
    else {
      cfd::core::Pubkey::GetHex_abi_cxx11_(&local_6c0,(Pubkey *)&test.net_type);
      bVar3 = std::__cxx11::string::empty();
      std::__cxx11::string::~string((string *)&local_6c0);
      if (((bVar3 ^ 0xff) & 1) == 0) {
        cfd::core::Script::GetHex_abi_cxx11_
                  (&local_8c8,
                   (Script *)
                   ((long)&test.pubkey.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data + 0x10));
        bVar3 = std::__cxx11::string::empty();
        std::__cxx11::string::~string((string *)&local_8c8);
        if (((bVar3 ^ 0xff) & 1) == 0) {
          local_ac1 = false;
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_ac0,&local_ac1,(type *)0x0);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ac0);
          if (!bVar2) {
            testing::Message::Message(&local_ad0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__2.message_,(internal *)local_ac0,
                       (AssertionResult *)0x73e56f,"true","false",in_R9);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_ad8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                       ,0x3ae,pcVar5);
            testing::internal::AssertHelper::operator=(&local_ad8,&local_ad0);
            testing::internal::AssertHelper::~AssertHelper(&local_ad8);
            std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
            testing::Message::~Message(&local_ad0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_ac0);
        }
        else {
          bVar2 = testing::internal::AlwaysTrue();
          if (bVar2) {
            bVar2 = testing::internal::AlwaysTrue();
            uVar1 = test.address.field_2._8_4_;
            if (bVar2) {
              cfd::core::GetElementsAddressFormatList();
              cfd::core::Address::Address
                        (&local_a40,uVar1,
                         (Script *)
                         ((long)&test.pubkey.data_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data + 0x10),&local_a58);
              cfd::core::Address::operator=((Address *)&__range1,&local_a40);
              cfd::core::Address::~Address(&local_a40);
              std::
              vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
              ~vector(&local_a58);
            }
          }
          else {
            testing::Message::Message(&local_a60);
            testing::internal::AssertHelper::AssertHelper
                      (&local_a68,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                       ,0x3aa,
                       "Expected: (addr = Address(test.net_type, test.script, GetElementsAddressFormatList())) doesn\'t throw an exception.\n  Actual: it throws."
                      );
            testing::internal::AssertHelper::operator=(&local_a68,&local_a60);
            testing::internal::AssertHelper::~AssertHelper(&local_a68);
            testing::Message::~Message(&local_a60);
          }
          cfd::core::HashUtil::Hash160
                    ((ByteData160 *)&gtest_ar__1.message_,
                     (Script *)
                     ((long)&test.pubkey.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data + 0x10));
          cfd::core::ByteData160::GetBytes(&local_a98,(ByteData160 *)&gtest_ar__1.message_);
          cfd::core::ByteData::ByteData(&local_a80,&local_a98);
          cfd::core::ByteData::operator=((ByteData *)local_240,&local_a80);
          cfd::core::ByteData::~ByteData(&local_a80);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a98);
          cfd::core::ByteData160::~ByteData160((ByteData160 *)&gtest_ar__1.message_);
        }
      }
      else {
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          bVar2 = testing::internal::AlwaysTrue();
          uVar1 = test.address.field_2._8_4_;
          if (bVar2) {
            cfd::core::GetElementsAddressFormatList();
            cfd::core::Address::Address(&local_838,uVar1,(Pubkey *)&test.net_type,&local_850);
            cfd::core::Address::operator=((Address *)&__range1,&local_838);
            cfd::core::Address::~Address(&local_838);
            std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
            ::~vector(&local_850);
          }
        }
        else {
          testing::Message::Message(&local_858);
          testing::internal::AssertHelper::AssertHelper
                    (&local_860,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                     ,0x3a5,
                     "Expected: (addr = Address(test.net_type, test.pubkey, GetElementsAddressFormatList())) doesn\'t throw an exception.\n  Actual: it throws."
                    );
          testing::internal::AssertHelper::operator=(&local_860,&local_858);
          testing::internal::AssertHelper::~AssertHelper(&local_860);
          testing::Message::~Message(&local_858);
        }
        cfd::core::HashUtil::Hash160(&local_8a8,(Pubkey *)&test.net_type);
        cfd::core::ByteData160::GetBytes(&local_890,&local_8a8);
        cfd::core::ByteData::ByteData(&local_878,&local_890);
        cfd::core::ByteData::operator=((ByteData *)local_240,&local_878);
        cfd::core::ByteData::~ByteData(&local_878);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_890);
        cfd::core::ByteData160::~ByteData160(&local_8a8);
      }
    }
    cfd::core::GetElementsAddressFormatList();
    bVar2 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress
                      ((string *)local_218,&local_b28);
    local_b09 = (bool)(~bVar2 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_b08,&local_b09,(type *)0x0);
    std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector(&local_b28);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b08);
    if (!bVar2) {
      testing::Message::Message(&local_b30);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar.message_,(internal *)local_b08,
                 (AssertionResult *)
                 "ElementsConfidentialAddress::IsConfidentialAddress(test.address, GetElementsAddressFormatList())"
                 ,"true","false",in_R9);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_b38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                 ,0x3b2,pcVar5);
      testing::internal::AssertHelper::operator=(&local_b38,&local_b30);
      testing::internal::AssertHelper::~AssertHelper(&local_b38);
      std::__cxx11::string::~string((string *)&gtest_ar.message_);
      testing::Message::~Message(&local_b30);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b08);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cfd::core::Address::GetAddress_abi_cxx11_(&local_b88,(Address *)&__range1);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_b68,"test.address.c_str()","addr.GetAddress().c_str()",pcVar5,
               pcVar6);
    std::__cxx11::string::~string((string *)&local_b88);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b68);
    if (!bVar2) {
      testing::Message::Message(&local_b90);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_b68);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                 ,0x3b3,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_b90);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_b90);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b68);
    if (test.address.field_2._12_4_ - 5 < 2) {
      local_bb0[1] = 1;
      local_bb0[0] = cfd::core::Address::GetAddressType((Address *)&__range1);
      testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
                ((EqHelper<false> *)local_ba8,"AddressType::kP2shAddress","addr.GetAddressType()",
                 local_bb0 + 1,local_bb0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ba8);
      if (!bVar2) {
        testing::Message::Message(&local_bb8);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_ba8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                   ,0x3b7,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_bb8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_bb8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_ba8);
    }
    else {
      local_bd4 = cfd::core::Address::GetAddressType((Address *)&__range1);
      testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
                ((EqHelper<false> *)local_bd0,"test.addr_type","addr.GetAddressType()",
                 (AddressType *)(test.address.field_2._M_local_buf + 0xc),&local_bd4);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bd0);
      if (!bVar2) {
        testing::Message::Message(&local_be0);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_bd0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                   ,0x3ba,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_be0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_be0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_bd0);
    }
    local_bfc = cfd::core::Address::GetNetType((Address *)&__range1);
    testing::internal::EqHelper<false>::Compare<cfd::core::NetType,cfd::core::NetType>
              ((EqHelper<false> *)local_bf8,"test.net_type","addr.GetNetType()",
               (NetType *)(test.address.field_2._M_local_buf + 8),&local_bfc);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bf8);
    if (!bVar2) {
      testing::Message::Message(&local_c08);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_bf8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                 ,0x3bd,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_c08);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_c08);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_bf8);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_c40,(ByteData *)local_240);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cfd::core::Address::GetHash(&local_c78,(Address *)&__range1);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_c60,&local_c78);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_c20,"hash.GetHex().c_str()","addr.GetHash().GetHex().c_str()",
               pcVar5,pcVar6);
    std::__cxx11::string::~string((string *)&local_c60);
    cfd::core::ByteData::~ByteData(&local_c78);
    std::__cxx11::string::~string((string *)&local_c40);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c20);
    if (!bVar2) {
      testing::Message::Message(&local_c80);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_c20);
      testing::internal::AssertHelper::AssertHelper
                (&local_c88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                 ,0x3be,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c88,&local_c80);
      testing::internal::AssertHelper::~AssertHelper(&local_c88);
      testing::Message::~Message(&local_c80);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c20);
    cfd::core::ByteData::~ByteData((ByteData *)local_240);
    anon_struct_120_5_385e3975::~ElementsUnblindedAddressTestVector
              ((anon_struct_120_5_385e3975 *)local_218);
    __gnu_cxx::
    __normal_iterator<const_ElementsUnblindedAddressTestVector_*,_std::vector<ElementsUnblindedAddressTestVector,_std::allocator<ElementsUnblindedAddressTestVector>_>_>
    ::operator++(&__end1);
  }
  cfd::core::Address::~Address((Address *)&__range1);
  return;
}

Assistant:

TEST(Address, ElementsSourceDataConstructorTest) {
  Address addr;
  for (ElementsUnblindedAddressTestVector test : test_vectors) {
    // pubkey/script constructor
    {
      ByteData hash;
      if ((test.addr_type == AddressType::kP2wpkhAddress)
          || (test.addr_type == AddressType::kP2wshAddress)) {
        // p2pkh constructor
        if (!test.pubkey.GetHex().empty()) {
          EXPECT_NO_THROW((addr = Address(test.net_type,
              WitnessVersion::kVersion0, test.pubkey,
              GetElementsAddressFormatList())));
          hash = ByteData(HashUtil::Hash160(test.pubkey).GetBytes());
        }
        // p2sh constructor
        else if (!test.script.GetHex().empty()) {
          EXPECT_NO_THROW((addr = Address(test.net_type,
              WitnessVersion::kVersion0, test.script,
              GetElementsAddressFormatList())));
          hash = ByteData(HashUtil::Sha256(test.script).GetBytes());
        }
        else {
          EXPECT_FALSE(true);
        }
      } else {
        // p2pkh constructor
        if (!test.pubkey.GetHex().empty()) {
          EXPECT_NO_THROW((addr = Address(test.net_type, test.pubkey, GetElementsAddressFormatList())));
          hash = ByteData(HashUtil::Hash160(test.pubkey).GetBytes());
        }
        // p2sh constructor
        else if (!test.script.GetHex().empty()) {
          EXPECT_NO_THROW((addr = Address(test.net_type, test.script, GetElementsAddressFormatList())));
          hash = ByteData(HashUtil::Hash160(test.script).GetBytes());
        }
        else {
          EXPECT_FALSE(true);
        }
      }

      EXPECT_FALSE(ElementsConfidentialAddress::IsConfidentialAddress(test.address, GetElementsAddressFormatList()));
      EXPECT_STREQ(test.address.c_str(), addr.GetAddress().c_str());
      switch (test.addr_type) {
        case AddressType::kP2shP2wshAddress:
        case AddressType::kP2shP2wpkhAddress:
          EXPECT_EQ(AddressType::kP2shAddress, addr.GetAddressType());
          break;
        default:
          EXPECT_EQ(test.addr_type, addr.GetAddressType());
          break;
      }
      EXPECT_EQ(test.net_type, addr.GetNetType());
      EXPECT_STREQ(hash.GetHex().c_str(), addr.GetHash().GetHex().c_str());
    }
  }
}